

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_kvs_index_pattern(int n_checkpoints,fdb_config fconfig,bool deletes,bool walflush)

{
  byte in_SIL;
  int in_EDI;
  fdb_kvs_config kvs_config;
  idx_prams_t index_params;
  checkpoint_t verification_checkpoint;
  storage_t *st;
  int i;
  int n;
  storage_t *in_stack_00000990;
  undefined1 in_stack_fffffffffffffb7f;
  checkpoint_t *v_chk;
  idx_prams_t *in_stack_fffffffffffffb88;
  fdb_kvs_config *in_stack_fffffffffffffb90;
  fdb_config *in_stack_fffffffffffffb98;
  fdb_config *in_stack_fffffffffffffba0;
  undefined1 local_448 [24];
  idx_prams_t *in_stack_fffffffffffffbd0;
  storage_t *in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffd0f;
  storage_t *in_stack_fffffffffffffd10;
  storage_t *in_stack_fffffffffffffd30;
  storage_t *in_stack_fffffffffffffd60;
  int local_10;
  int local_c;
  
  v_chk = (checkpoint_t *)&stack0x00000008;
  fdb_get_default_kvs_config();
  memleak_start();
  rm_storage_fs();
  gen_index_params(in_stack_fffffffffffffbd0);
  memset(local_448,0,0x430);
  init_storage(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88,v_chk,(bool)in_stack_fffffffffffffb7f);
  for (local_c = 0; local_c < in_EDI; local_c = local_c + 1) {
    start_checkpoint(in_stack_fffffffffffffbf0);
    for (local_10 = 0; local_10 < 100; local_10 = local_10 + 1) {
      load_persons(in_stack_00000990);
      if ((in_SIL & 1) != 0) {
        delete_persons(in_stack_fffffffffffffbf0);
      }
      verify_db(in_stack_fffffffffffffd30);
    }
    end_checkpoint(in_stack_fffffffffffffbf0);
    update_index(in_stack_fffffffffffffd10,(bool)in_stack_fffffffffffffd0f);
    verify_db(in_stack_fffffffffffffd30);
  }
  if (v_chk->key[0x2e] != '\x01') {
    replay(in_stack_fffffffffffffd60);
  }
  e2e_fdb_shutdown((storage_t *)0x105a73);
  memleak_end();
  return;
}

Assistant:

void e2e_kvs_index_pattern(int n_checkpoints, fdb_config fconfig,
                           bool deletes, bool walflush) {

    int n, i;
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    n_checkpoints = n_checkpoints * LOAD_FACTOR;

    memleak_start();

    // init
    rm_storage_fs();
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));

    // setup
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // test
    for (n = 0; n < n_checkpoints; ++n) {

        // checkpoint
        start_checkpoint(st);

        for (i = 0; i < 100; ++i) {
#ifdef __DEBUG_E2E
            printf("\n\n----%d----\n", i);
#endif
            load_persons(st);
            if (deletes) {
                delete_persons(st);
            }
            verify_db(st);
        }

        // end checkpoint
        end_checkpoint(st);

        // change index range
        update_index(st, true);
        verify_db(st);

    }

    if (fconfig.compaction_mode != FDB_COMPACTION_AUTO) {
        /* replay involves rollbacks but
         * cannot rollback pre compact due to BUG: MB-13130
         */
        replay(st);
    }

    // teardown
    e2e_fdb_shutdown(st);

    memleak_end();
}